

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O3

void ncnn::convdw3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  void *pvVar17;
  size_t sVar18;
  size_t sVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float *pfVar29;
  long lVar30;
  float *pfVar31;
  float *pfVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  
  iVar11 = bottom_blob->c;
  if (0 < (long)iVar11) {
    iVar12 = top_blob->w;
    uVar13 = top_blob->h;
    lVar41 = (long)bottom_blob->w;
    lVar1 = lVar41 + 2;
    pvVar14 = top_blob->data;
    sVar15 = top_blob->cstep;
    sVar16 = top_blob->elemsize;
    pvVar17 = bottom_blob->data;
    sVar18 = bottom_blob->cstep;
    sVar19 = bottom_blob->elemsize;
    lVar33 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        fVar42 = 0.0;
      }
      else {
        fVar42 = *(float *)((long)&_bias->data + lVar33 * 4);
      }
      pfVar36 = (float *)(sVar15 * sVar16 * lVar33 + (long)pvVar14);
      pfVar38 = (float *)(sVar18 * sVar19 * lVar33 + (long)pvVar17);
      lVar20 = lVar33 * 0x24;
      pfVar32 = pfVar38 + lVar41;
      pfVar29 = pfVar38 + lVar41 * 2;
      pfVar37 = pfVar36;
      uVar34 = 0;
      if (1 < (int)uVar13) {
        pfVar31 = pfVar38 + lVar41 * 3;
        iVar39 = 0;
        do {
          pfVar36 = pfVar36 + iVar12;
          if (0 < iVar12) {
            lVar30 = 0;
            uVar34 = iVar12 + 1U;
            do {
              uVar9 = *(undefined8 *)((long)pfVar38 + lVar30 + 4);
              uVar10 = *(undefined8 *)((long)pfVar32 + lVar30 + 4);
              pfVar2 = (float *)((long)&_kernel->data + lVar20);
              fVar21 = *pfVar2;
              fVar22 = pfVar2[1];
              fVar23 = pfVar2[2];
              fVar24 = pfVar2[3];
              pfVar2 = (float *)((long)&_kernel->elemsize + lVar20);
              fVar25 = *pfVar2;
              fVar26 = pfVar2[1];
              fVar27 = pfVar2[2];
              fVar28 = pfVar2[3];
              fVar5 = *(float *)((long)pfVar32 + lVar30);
              fVar43 = (float)uVar10;
              fVar44 = (float)((ulong)uVar10 >> 0x20);
              fVar45 = (float)*(undefined8 *)((long)pfVar29 + lVar30);
              fVar46 = (float)((ulong)*(undefined8 *)((long)pfVar29 + lVar30) >> 0x20);
              fVar6 = *(float *)((long)pfVar29 + lVar30 + 8);
              fVar7 = (float)(&_kernel->dims)[lVar33 * 9];
              uVar10 = *(undefined8 *)((long)pfVar31 + lVar30);
              fVar8 = *(float *)((long)pfVar31 + lVar30 + 8);
              *(float *)((long)pfVar37 + lVar30) =
                   fVar7 * fVar6 + fVar42 +
                   fVar46 * fVar28 + fVar5 * fVar24 + fVar44 * fVar26 + (float)uVar9 * fVar22 +
                   fVar45 * fVar27 + (float)((ulong)uVar9 >> 0x20) * fVar23 +
                   fVar43 * fVar25 + *(float *)((long)pfVar38 + lVar30) * fVar21;
              *(float *)((long)pfVar36 + lVar30) =
                   fVar7 * fVar8 + fVar42 +
                   (float)((ulong)uVar10 >> 0x20) * fVar28 + fVar24 * fVar45 +
                   fVar6 * fVar26 + fVar22 * fVar43 +
                   (float)uVar10 * fVar27 + fVar23 * fVar44 + fVar46 * fVar25 + fVar5 * fVar21;
              lVar30 = lVar30 + 4;
              uVar34 = uVar34 - 1;
            } while (1 < uVar34);
            pfVar37 = (float *)((long)pfVar37 + lVar30);
            pfVar36 = (float *)((long)pfVar36 + lVar30);
            pfVar38 = (float *)((long)pfVar38 + lVar30);
            pfVar32 = (float *)((long)pfVar32 + lVar30);
            pfVar29 = (float *)((long)pfVar29 + lVar30);
            pfVar31 = (float *)((long)pfVar31 + lVar30);
          }
          pfVar38 = pfVar38 + lVar1;
          pfVar32 = pfVar32 + lVar1;
          pfVar29 = pfVar29 + lVar1;
          pfVar31 = pfVar31 + lVar1;
          pfVar37 = pfVar37 + iVar12;
          iVar40 = iVar39 + 3;
          iVar39 = iVar39 + 2;
          uVar34 = uVar13 & 0xfffffffe;
        } while (iVar40 < (int)uVar13);
      }
      if ((int)uVar34 < (int)uVar13) {
        do {
          uVar35 = iVar12 + 1U;
          if (0 < iVar12) {
            do {
              pfVar36 = pfVar38 + 1;
              fVar5 = *pfVar38;
              pfVar38 = pfVar38 + 1;
              fVar6 = *pfVar32;
              pfVar31 = pfVar32 + 1;
              pfVar32 = pfVar32 + 1;
              uVar9 = *(undefined8 *)pfVar29;
              pfVar2 = pfVar29 + 2;
              pfVar29 = pfVar29 + 1;
              pfVar3 = (float *)((long)&_kernel->data + lVar20);
              pfVar4 = (float *)((long)&_kernel->elemsize + lVar20);
              *pfVar37 = (float)(&_kernel->dims)[lVar33 * 9] * *pfVar2 + fVar42 +
                         (float)((ulong)uVar9 >> 0x20) * pfVar4[3] + fVar6 * pfVar3[3] +
                         (float)((ulong)*(undefined8 *)pfVar31 >> 0x20) * pfVar4[1] +
                         (float)*(undefined8 *)pfVar36 * pfVar3[1] +
                         (float)uVar9 * pfVar4[2] +
                         (float)((ulong)*(undefined8 *)pfVar36 >> 0x20) * pfVar3[2] +
                         (float)*(undefined8 *)pfVar31 * *pfVar4 + fVar5 * *pfVar3;
              pfVar37 = pfVar37 + 1;
              uVar35 = uVar35 - 1;
            } while (1 < uVar35);
          }
          pfVar38 = pfVar38 + 2;
          pfVar32 = pfVar32 + 2;
          pfVar29 = pfVar29 + 2;
          uVar34 = uVar34 + 1;
        } while (uVar34 != uVar13);
      }
      lVar33 = lVar33 + 1;
    } while (lVar33 != iVar11);
  }
  return;
}

Assistant:

static void convdw3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g=0; g<group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g*9;

        float* outptr = out;
        float* outptr2 = outptr + outw;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w*2;
        const float* r3 = img0 + w*3;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i+1 < outh; i+=2)
        {

            int remain = outw;

            for (; remain>0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                float sum2 = bias0;
                sum2 += r1[0] * k0[0];
                sum2 += r1[1] * k0[1];
                sum2 += r1[2] * k0[2];
                sum2 += r2[0] * k1[0];
                sum2 += r2[1] * k1[1];
                sum2 += r2[2] * k1[2];
                sum2 += r3[0] * k2[0];
                sum2 += r3[1] * k2[1];
                sum2 += r3[2] * k2[2];

                *outptr = sum;
                *outptr2 = sum2;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
                outptr2++;
            }

            r0 += 2 + w;
            r1 += 2 + w;
            r2 += 2 + w;
            r3 += 2 + w;

            outptr += outw;
            outptr2 += outw;
        }

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain>0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}